

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_sub.cpp
# Opt level: O3

long duckdb::DateSub::MonthOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>
               (timestamp_t start_ts,timestamp_t end_ts)

{
  int iVar1;
  long lVar2;
  int32_t mm;
  int32_t yyyy;
  date_t start_date;
  int32_t dd;
  dtime_t start_time;
  dtime_t end_time;
  date_t end_date;
  int local_58;
  int local_54;
  date_t local_50;
  int local_4c;
  dtime_t local_48;
  dtime_t local_40;
  date_t local_34;
  
  if (end_ts.value < start_ts.value) {
    lVar2 = Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>(end_ts,start_ts);
    lVar2 = -lVar2;
  }
  else {
    duckdb::Timestamp::Convert(end_ts,&local_34,&local_40);
    duckdb::Date::Convert(local_34,&local_54,&local_58,&local_4c);
    iVar1 = duckdb::Date::MonthDays(local_54,local_58);
    if (iVar1 == local_4c) {
      duckdb::Timestamp::Convert(start_ts,&local_50,&local_48);
      duckdb::Date::Convert(local_50,&local_54,&local_58,&local_4c);
      if ((iVar1 < local_4c) || ((local_4c == iVar1 && (local_48.micros < local_40.micros)))) {
        local_50.days = duckdb::Date::FromDate(local_54,local_58,iVar1);
        start_ts.value = duckdb::Timestamp::FromDatetime(local_50,local_48);
      }
    }
    iVar1 = duckdb::Interval::GetAge(end_ts,start_ts);
    lVar2 = (long)iVar1;
  }
  return lVar2;
}

Assistant:

static inline TR Operation(TA start_ts, TB end_ts) {

			if (start_ts > end_ts) {
				return -MonthOperator::Operation<TA, TB, TR>(end_ts, start_ts);
			}
			// The number of complete months depends on whether end_ts is on the last day of the month.
			date_t end_date;
			dtime_t end_time;
			Timestamp::Convert(end_ts, end_date, end_time);

			int32_t yyyy, mm, dd;
			Date::Convert(end_date, yyyy, mm, dd);
			const auto end_days = Date::MonthDays(yyyy, mm);
			if (end_days == dd) {
				// Now check whether the start day is after the end day
				date_t start_date;
				dtime_t start_time;
				Timestamp::Convert(start_ts, start_date, start_time);
				Date::Convert(start_date, yyyy, mm, dd);
				if (dd > end_days || (dd == end_days && start_time < end_time)) {
					// Move back to the same time on the last day of the (shorter) end month
					start_date = Date::FromDate(yyyy, mm, end_days);
					start_ts = Timestamp::FromDatetime(start_date, start_time);
				}
			}

			// Our interval difference will now give the correct result.
			// Note that PG gives different interval subtraction results,
			// so if we change this we will have to reimplement.
			return Interval::GetAge(end_ts, start_ts).months;
		}